

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O2

Gia_Man_t * Bac_ManExtract(Bac_Man_t *p,int fBuffers,int fVerbose)

{
  Bac_Ntk_t *pBVar1;
  Bac_Ntk_t *pBVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Bac_Ntk_t *p_00;
  ulong uVar7;
  Gia_Man_t *p_01;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int Counter;
  int i_1;
  long lVar15;
  int i;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  
  p_00 = Bac_ManRoot(p);
  (p->vBuf2LeafNtk).nSize = 0;
  (p->vBuf2LeafObj).nSize = 0;
  (p->vBuf2RootNtk).nSize = 0;
  (p->vBuf2RootObj).nSize = 0;
  for (lVar12 = 1; uVar7 = (ulong)p->nNtks, lVar12 <= (long)uVar7; lVar12 = lVar12 + 1) {
    pBVar1 = p->pNtks;
    pBVar2 = pBVar1 + lVar12;
    Vec_IntFill(&pBVar1[lVar12].vIndex,pBVar1[lVar12].vType.nSize,-1);
    for (iVar14 = 0; iVar14 < (pBVar2->vInputs).nSize; iVar14 = iVar14 + 1) {
      iVar3 = Vec_IntEntry(&pBVar1[lVar12].vInputs,iVar14);
      Bac_ObjSetIndex(pBVar2,iVar3,iVar14);
    }
    for (iVar14 = 0; iVar14 < (pBVar2->vOutputs).nSize; iVar14 = iVar14 + 1) {
      iVar3 = Vec_IntEntry(&pBVar2->vOutputs,iVar14);
      Bac_ObjSetIndex(pBVar2,iVar3,iVar14);
    }
    iVar3 = 0;
    iVar18 = 1;
    iVar14 = -1;
    for (iVar16 = 0; iVar16 < (pBVar2->vType).nSize; iVar16 = iVar16 + 1) {
      iVar4 = Bac_ObjIsBox(pBVar2,iVar16);
      if (iVar4 != 0) {
        iVar4 = iVar14;
        for (iVar13 = 0; iVar3 + iVar13 != 0; iVar13 = iVar13 + 1) {
          iVar5 = Bac_ObjIsBi(pBVar2,iVar4);
          if (iVar5 == 0) break;
          Bac_ObjSetIndex(pBVar2,iVar4,iVar13);
          iVar4 = iVar4 + -1;
        }
        iVar4 = 0;
        while( true ) {
          iVar13 = iVar18 + iVar4;
          if ((pBVar2->vType).nSize <= iVar13) break;
          iVar5 = Bac_ObjIsBo(pBVar2,iVar13);
          if (iVar5 == 0) break;
          Bac_ObjSetIndex(pBVar2,iVar13,iVar4);
          iVar4 = iVar4 + 1;
        }
      }
      iVar3 = iVar3 + -1;
      iVar14 = iVar14 + 1;
      iVar18 = iVar18 + 1;
    }
    Bac_NtkStartCopies(pBVar2);
  }
  iVar14 = 0;
  for (lVar12 = 1; lVar12 <= (int)uVar7; lVar12 = lVar12 + 1) {
    pBVar2 = p->pNtks;
    iVar3 = pBVar2[lVar12].vType.nSize;
    iVar18 = 0;
    iVar16 = iVar3;
    for (lVar15 = 0; lVar15 < iVar16; lVar15 = lVar15 + 1) {
      uVar6 = Abc_Lit2Var((int)pBVar2[lVar12].vType.pArray[lVar15]);
      iVar18 = iVar18 + (uint)(uVar6 < 5);
      iVar16 = pBVar2[lVar12].vType.nSize;
    }
    iVar14 = (iVar3 + iVar14) - iVar18;
    uVar7 = (ulong)(uint)p->nNtks;
  }
  p_01 = Gia_ManStart(iVar14);
  pcVar8 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar8;
  pcVar8 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar8;
  for (iVar14 = 0; iVar14 < (p_00->vInputs).nSize; iVar14 = iVar14 + 1) {
    iVar3 = Vec_IntEntry(&p_00->vInputs,iVar14);
    pGVar9 = Gia_ManAppendObj(p_01);
    uVar7 = *(ulong *)pGVar9;
    *(ulong *)pGVar9 = uVar7 | 0x9fffffff;
    *(ulong *)pGVar9 =
         uVar7 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
    pVVar10 = p_01->vCis;
    iVar16 = Gia_ObjId(p_01,pGVar9);
    Vec_IntPush(pVVar10,iVar16);
    iVar16 = Gia_ObjId(p_01,pGVar9);
    Bac_ObjSetCopy(p_00,iVar3,iVar16 * 2);
  }
  pGVar11 = p_01;
  Gia_ManHashAlloc(p_01);
  iVar14 = (int)pGVar11;
  pVVar10 = Vec_IntAlloc(iVar14);
  p_01->vBarBufs = pVVar10;
  pVVar10 = Vec_IntAlloc(iVar14);
  pVVar10->nSize = 10000;
  if (pVVar10->pArray != (int *)0x0) {
    memset(pVVar10->pArray,0xff,40000);
  }
  Bac_ManPrepareGates(p);
  for (iVar14 = 0; iVar14 < (p_00->vOutputs).nSize; iVar14 = iVar14 + 1) {
    iVar3 = Vec_IntEntry(&p_00->vOutputs,iVar14);
    Bac_ManExtract_rec(p_01,p_00,iVar3,fBuffers,pVVar10);
  }
  Bac_ManUndoGates(p);
  if (pVVar10 != (Vec_Int_t *)0x0) {
    free(pVVar10->pArray);
    free(pVVar10);
  }
  Gia_ManHashStop(p_01);
  iVar14 = 0;
  while( true ) {
    if ((p_00->vOutputs).nSize <= iVar14) {
      if ((p->vBuf2LeafNtk).nSize == p_01->nBufs) {
        pGVar11 = Gia_ManCleanup(p_01);
        Gia_ManStop(p_01);
        return pGVar11;
      }
      __assert_fail("Vec_IntSize(&p->vBuf2LeafNtk) == pNew->nBufs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                    ,0x101,"Gia_Man_t *Bac_ManExtract(Bac_Man_t *, int, int)");
    }
    iVar3 = Vec_IntEntry(&p_00->vOutputs,iVar14);
    uVar6 = Vec_IntEntry(&p_00->vCopy,iVar3);
    if ((int)uVar6 < 0) break;
    iVar3 = Abc_Lit2Var(uVar6);
    if (p_01->nObjs <= iVar3) break;
    iVar3 = Abc_Lit2Var(uVar6);
    pGVar9 = Gia_ManObj(p_01,iVar3);
    if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && (int)*(uint *)pGVar9 < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar9 = Gia_ManAppendObj(p_01);
    *(ulong *)pGVar9 = *(ulong *)pGVar9 | 0x80000000;
    iVar3 = Gia_ObjId(p_01,pGVar9);
    iVar16 = Abc_Lit2Var(uVar6);
    uVar19 = (ulong)(iVar3 - iVar16 & 0x1fffffff);
    uVar7 = *(ulong *)pGVar9;
    uVar17 = (ulong)((uVar6 & 1) << 0x1d);
    *(ulong *)pGVar9 = uVar17 | uVar7 & 0xffffffffc0000000 | uVar19;
    *(ulong *)pGVar9 =
         uVar17 | uVar7 & 0xe0000000c0000000 | uVar19 |
         (ulong)(p_01->vCos->nSize & 0x1fffffff) << 0x20;
    pVVar10 = p_01->vCos;
    iVar3 = Gia_ObjId(p_01,pGVar9);
    Vec_IntPush(pVVar10,iVar3);
    if (p_01->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(p_01,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff),pGVar9);
    }
    Gia_ObjId(p_01,pGVar9);
    iVar14 = iVar14 + 1;
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Bac_ManExtract( Bac_Man_t * p, int fBuffers, int fVerbose )
{
    Bac_Ntk_t * pNtk, * pRoot = Bac_ManRoot(p);
    Gia_Man_t * pNew, * pTemp; 
    Vec_Int_t * vMap = NULL;
    int i, iObj;

    Vec_IntClear( &p->vBuf2LeafNtk );
    Vec_IntClear( &p->vBuf2LeafObj );
    Vec_IntClear( &p->vBuf2RootNtk );
    Vec_IntClear( &p->vBuf2RootObj );

    Bac_ManForEachNtk( p, pNtk, i )
    {
        Bac_NtkDeriveIndex( pNtk );
        Bac_NtkStartCopies( pNtk );
    }

    // start the manager
    pNew = Gia_ManStart( Bac_ManNodeNum(p) );
    pNew->pName = Abc_UtilStrsav(p->pName);
    pNew->pSpec = Abc_UtilStrsav(p->pSpec);

    // primary inputs
    Bac_NtkForEachPi( pRoot, iObj, i )
        Bac_ObjSetCopy( pRoot, iObj, Gia_ManAppendCi(pNew) );

    // internal nodes
    Gia_ManHashAlloc( pNew );
    pNew->vBarBufs = Vec_IntAlloc( 10000 );
    vMap = Vec_IntStartFull( 10000 );
    Bac_ManPrepareGates( p );
    Bac_NtkForEachPo( pRoot, iObj, i )
        Bac_ManExtract_rec( pNew, pRoot, iObj, fBuffers, vMap );
    Bac_ManUndoGates( p );
    Vec_IntFreeP( &vMap );
    Gia_ManHashStop( pNew );

    // primary outputs
    Bac_NtkForEachPo( pRoot, iObj, i )
        Gia_ManAppendCo( pNew, Bac_ObjCopy(pRoot, iObj) );
    assert( Vec_IntSize(&p->vBuf2LeafNtk) == pNew->nBufs );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    //Gia_ManPrintStats( pNew, NULL );
    return pNew;
}